

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O0

FUDMFKey * __thiscall FUDMFKey::operator=(FUDMFKey *this,FString *val)

{
  char *pcVar1;
  long lVar2;
  double dVar3;
  FString *val_local;
  FUDMFKey *this_local;
  
  this->Type = 2;
  pcVar1 = FString::GetChars(val);
  lVar2 = strtol(pcVar1,(char **)0x0,0);
  this->IntVal = (int)lVar2;
  pcVar1 = FString::GetChars(val);
  dVar3 = strtod(pcVar1,(char **)0x0);
  this->FloatVal = dVar3;
  FString::operator=(&this->StringVal,val);
  return this;
}

Assistant:

FUDMFKey& operator =(const FString &val)
	{
		Type = UDMF_String;
		IntVal = strtol(val.GetChars(), NULL, 0);
		FloatVal = strtod(val.GetChars(), NULL);
		StringVal = val;
		return *this;
	}